

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O2

void __thiscall
PreciseMeasurement_powroot_Test::PreciseMeasurement_powroot_Test
          (PreciseMeasurement_powroot_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001add58;
  return;
}

Assistant:

TEST(PreciseMeasurement, powroot)
{
    precise_measurement m1(2.0, precise::m);

    auto v1 = pow(m1, 3);
    EXPECT_EQ(v1.value(), 8.0);
    EXPECT_EQ(v1.units(), precise::m.pow(3));
#ifndef UNITS_HEADER_ONLY
    auto m2 = root(v1, 3);
    EXPECT_TRUE(m2 == m1);
    precise_measurement m4(16.0, precise::m.pow(2));
    EXPECT_EQ(sqrt(m4), precise_measurement(4.0, precise::m));
#endif
}